

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void riscv_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  target_ulong tVar1;
  CPUArchState_conflict26 *env;
  target_ulong tVar2;
  ulong uVar3;
  long lVar4;
  uc_struct_conflict13 *puVar5;
  uint uVar6;
  _Bool _Var7;
  uint32_t uVar8;
  uint uVar9;
  uintptr_t o_3;
  undefined1 *puVar10;
  undefined8 *puVar11;
  TCGv_i32 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i64 pTVar14;
  uint uVar15;
  uint uVar16;
  uintptr_t o_5;
  TCGCond cond;
  MemOp MVar17;
  uintptr_t o_6;
  code *pcVar18;
  uintptr_t o_1;
  TCGTemp *pTVar19;
  TCGContext_conflict11 *pTVar20;
  byte bVar21;
  TCGContext_conflict11 *pTVar22;
  byte bVar23;
  ulong uVar24;
  uintptr_t o_2;
  arg_jal aVar25;
  uintptr_t o;
  TCGTemp *pTVar26;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar27;
  bool bVar28;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  TCGTemp *local_a8;
  TCGTemp *local_a0;
  arg_jal local_90;
  ulong local_88;
  DisasContext_conflict12 *local_80;
  TCGContext_conflict11 *local_78;
  void *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  arg_jal local_48;
  TCGTemp *local_40;
  
  tVar1 = dcbase[2].pc_first;
  pTVar20 = *(TCGContext_conflict11 **)(tVar1 + 0x2e8);
  env = (CPUArchState_conflict26 *)cpu->env_ptr;
  uVar8 = cpu_lduw_code_riscv64(env,dcbase->pc_next);
  uVar24 = (ulong)uVar8;
  tVar2 = dcbase->pc_next;
  local_b8._0_4_ = (undefined4)tVar2;
  local_b8._4_4_ = (undefined4)(tVar2 >> 0x20);
  if (*(int *)(tVar1 + 0x57c) == 0) {
    bVar28 = *(target_ulong *)(tVar1 + 0x578 + (long)*(int *)(tVar1 + 0x39e0) * 8) == tVar2;
  }
  else {
    puVar10 = (undefined1 *)g_tree_lookup(*(GTree **)(tVar1 + 0x780),local_b8);
    bVar28 = puVar10 == &DAT_00000001;
  }
  pTVar19 = (TCGTemp *)CONCAT44(uStack_ac,local_b8._8_4_);
  if (bVar28) {
    dcbase->is_jmp = DISAS_TARGET_6;
    return;
  }
  uVar3 = dcbase->pc_next;
  for (puVar11 = *(undefined8 **)(tVar1 + 0x358); bVar28 = puVar11 != (undefined8 *)0x0, bVar28;
      puVar11 = (undefined8 *)*puVar11) {
    lVar4 = puVar11[1];
    if ((((*(ulong *)(lVar4 + 0x18) <= uVar3) && (uVar3 <= *(ulong *)(lVar4 + 0x20))) ||
        (*(ulong *)(lVar4 + 0x20) < *(ulong *)(lVar4 + 0x18))) &&
       (*(char *)(lVar4 + 0x14) != '\x01')) break;
  }
  local_78 = (TCGContext_conflict11 *)env;
  if (bVar28) {
    local_88 = uVar24;
    tcg_gen_op2_riscv64(pTVar20,INDEX_op_movi_i64,(TCGArg)(pTVar20->cpu_pc + (long)pTVar20),uVar3);
    local_70 = ((pTVar20->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar2 = dcbase->pc_next;
    local_80 = (DisasContext_conflict12 *)dcbase;
    pTVar12 = tcg_const_i32_riscv64(pTVar20,4);
    pTVar13 = tcg_const_i64_riscv64(pTVar20,tVar1);
    pTVar14 = tcg_const_i64_riscv64(pTVar20,tVar2);
    pTVar26 = (TCGTemp *)(pTVar13 + (long)pTVar20);
    pTVar19 = (TCGTemp *)(pTVar14 + (long)pTVar20);
    aVar25 = (arg_jal)((long)pTVar12 + (long)pTVar20);
    local_40 = (TCGTemp *)0x0;
    local_90 = aVar25;
    local_68 = pTVar19;
    local_60 = pTVar26;
    local_58 = pTVar26;
    local_50 = pTVar19;
    local_48 = aVar25;
    if (*(int *)(tVar1 + 0x4f8) == 1) {
      puVar11 = *(undefined8 **)(tVar1 + 0x358);
      while( true ) {
        if (puVar11 == (undefined8 *)0x0) break;
        lVar4 = puVar11[1];
        if (*(char *)(lVar4 + 0x14) == '\0') {
          pTVar13 = tcg_const_i64_riscv64(pTVar20,*(int64_t *)(lVar4 + 0x30));
          local_40 = (TCGTemp *)(pTVar13 + (long)pTVar20);
          (**(code **)(tVar1 + 0x178))(tVar1,lVar4,&local_58,4);
          tcg_temp_free_internal_riscv64(pTVar20,(TCGTemp *)(pTVar13 + (long)pTVar20));
        }
        puVar11 = (undefined8 *)*puVar11;
      }
    }
    else {
      pTVar12 = tcg_const_i32_riscv64(pTVar20,2);
      local_a8 = pTVar26;
      local_a0 = pTVar19;
      local_b8._0_8_ = aVar25;
      unique0x1000102a = (TCGTemp *)(pTVar12 + (long)pTVar20);
      tcg_gen_callN_riscv64(pTVar20,helper_uc_tracecode,(TCGTemp *)0x0,4,(TCGTemp **)local_b8);
      tcg_temp_free_internal_riscv64(pTVar20,(TCGTemp *)(pTVar12 + (long)pTVar20));
    }
    tcg_temp_free_internal_riscv64(pTVar20,local_68);
    tcg_temp_free_internal_riscv64(pTVar20,local_60);
    tcg_temp_free_internal_riscv64(pTVar20,(TCGTemp *)local_90);
    check_exit_request_riscv64(pTVar20);
    uVar24 = local_88;
    dcbase = &local_80->base;
    pTVar19 = stack0xffffffffffffff50;
  }
  else {
    local_70 = (void *)0x0;
  }
  uStack_ac = (undefined4)((ulong)pTVar19 >> 0x20);
  uVar6 = (uint)uVar24;
  uVar9 = uVar6 & 0xffff;
  unique0x10001182 = pTVar19;
  if (((ushort)uVar24 & 3) == 3) {
    uVar8 = cpu_lduw_code_riscv64
                      ((CPUArchState_conflict26 *)local_78,
                       (((DisasContext_conflict12 *)dcbase)->base).pc_next + 2);
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next + 4;
    _Var7 = decode_insn32((DisasContext_conflict12 *)dcbase,uVar9 | uVar8 << 0x10);
    if (_Var7) goto LAB_00c769c7;
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next - 4;
    pTVar19 = stack0xffffffffffffff50;
  }
  else if ((((DisasContext_conflict12 *)dcbase)->misa & 4) != 0) {
    puVar5 = ((DisasContext_conflict12 *)dcbase)->uc;
    ((DisasContext_conflict12 *)dcbase)->invalid = false;
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next + 2;
    uVar15 = uVar6 & 0xe003;
    aVar25 = (arg_jal)local_b8._0_8_;
    if (uVar15 < 0x6002) {
      if (0x2001 < uVar15) {
        if (0x4001 < uVar15) {
          if (uVar15 == 0x4002) {
            if ((uVar24 & 0xf80) != 0) {
              local_b8._0_4_ =
                   (((uint)(uVar24 >> 9) & 8 | (uint)(uVar24 >> 4) & 7) + (uVar6 & 0xc) * 4) * 4;
              local_b8._8_4_ = 2;
              local_b8._4_4_ = uVar6 >> 7 & 0x1f;
              goto LAB_00c77395;
            }
          }
          else {
            if (uVar15 == 0x6000) {
              local_b8._0_4_ = (uVar9 >> 2 & 0x18 | (uint)(uVar24 >> 10) & 7) << 3;
              local_b8._8_4_ = uVar6 >> 7 & 7 | 8;
              local_b8._4_4_ = uVar9 >> 2 & 7 | 8;
              goto LAB_00c771e0;
            }
            if (uVar15 != 0x6001) goto LAB_00c77236;
            if ((uVar24 & 0x107c) != 0) {
              if ((uVar6 & 0xf80) != 0x100) {
                local_b8._0_4_ =
                     ((int)(uVar6 << 0x13) >> 0x1f & 0xfffe0U | (uint)(uVar24 >> 2) & 0x1f) << 0xc;
                local_b8._4_4_ = uVar6 >> 7 & 0x1f;
                if (local_b8._4_4_ != 0) {
                  pTVar22 = puVar5->tcg_ctx;
                  tcg_gen_op2_riscv64(pTVar22,INDEX_op_movi_i64,
                                      (TCGArg)((long)&pTVar22->pool_cur +
                                              (long)pTVar22->cpu_gpr[(uint)local_b8._4_4_]),
                                      (long)(int)local_b8._0_4_);
                }
                goto LAB_00c774ff;
              }
              local_b8._0_4_ =
                   ((int)(uVar6 << 0x13) >> 0x1f & 0xfffffe0U |
                   uVar6 & 0x18 | (uint)(uVar24 >> 1) & 2 | (uint)(uVar24 >> 6) & 1 |
                   (uint)(uVar24 >> 3) & 4) << 4;
              local_b8._4_4_ = 2;
              local_b8._8_4_ = 2;
              goto LAB_00c77016;
            }
          }
LAB_00c774f2:
          generate_exception((DisasContext_conflict12 *)dcbase,2);
          goto LAB_00c774ff;
        }
        if (uVar15 == 0x2002) {
          local_b8._0_4_ =
               (((uint)(uVar24 >> 10) & 4 | (uint)(uVar24 >> 5) & 3) + (uVar6 & 0x1c) * 2) * 8;
          local_b8._8_4_ = 2;
          local_b8._4_4_ = (uint)(uVar24 >> 7) & 0x1f;
LAB_00c77226:
          _Var7 = trans_fld((DisasContext_conflict12 *)dcbase,(arg_fld *)local_b8);
          goto LAB_00c7722e;
        }
        if (uVar15 != 0x4000) {
          if (uVar15 == 0x4001) {
            local_b8._0_4_ = (int)(uVar6 << 0x13) >> 0x1f & 0xffffffe0U | (uint)(uVar24 >> 2) & 0x1f
            ;
            local_b8._8_4_ = 0;
LAB_00c76b33:
            local_b8._4_4_ = uVar6 >> 7 & 0x1f;
            goto LAB_00c77016;
          }
          goto LAB_00c77236;
        }
        local_b8._0_4_ =
             ((uint)(uVar24 >> 1) & 0x10 | (uint)(uVar24 >> 9) & 0xe | (uint)(uVar24 >> 6) & 1) << 2
        ;
        local_b8._8_4_ = (uint)(uVar24 >> 7) & 7 | 8;
        local_b8._4_4_ = uVar6 >> 2 & 7 | 8;
LAB_00c77395:
        MVar17 = MO_LESL;
LAB_00c773a1:
        gen_load((DisasContext_conflict12 *)dcbase,(arg_lb *)local_b8,MVar17);
        goto LAB_00c774ff;
      }
      if (uVar15 == 1 || (uVar24 & 0xe003) == 0) {
        if ((uVar24 & 0xe003) == 0) {
          if ((uVar24 & 0x1fe0) == 0) {
            ((DisasContext_conflict12 *)dcbase)->invalid = true;
            goto LAB_00c774f2;
          }
          local_b8._0_4_ =
               ((uint)(uVar24 >> 3) & 0xf0 |
               (uint)(uVar24 >> 9) & 0xc | (uint)(uVar24 >> 4) & 2 | (uint)(uVar24 >> 6) & 1) << 2;
          local_b8._8_4_ = 2;
          local_b8._4_4_ = uVar6 >> 2 & 7 | 8;
        }
        else {
          if (uVar15 != 1) goto LAB_00c77236;
          local_b8._0_4_ = (int)(uVar6 << 0x13) >> 0x1f & 0xffffffe0U | (uint)(uVar24 >> 2) & 0x1f;
          local_b8._4_4_ = uVar6 >> 7 & 0x1f;
          local_b8._8_4_ = local_b8._4_4_;
        }
LAB_00c77016:
        pcVar18 = tcg_gen_addi_i64_riscv64;
LAB_00c7701d:
        gen_arith_imm_fn((DisasContext_conflict12 *)dcbase,(arg_i_conflict *)local_b8,pcVar18);
        goto LAB_00c774ff;
      }
      if (uVar15 == 2) {
        local_b8._0_4_ = uVar9 >> 7 & 0x1f;
        uVar9 = uVar9 >> 7 & 0x20 | (uint)(uVar24 >> 2) & 0x1f;
        local_b8._8_4_ = 0x40;
        if (uVar9 != 0) {
          local_b8._8_4_ = uVar9;
        }
        local_b8._4_4_ = local_b8._0_4_;
        _Var7 = trans_slli((DisasContext_conflict12 *)dcbase,(arg_slli *)local_b8);
        goto LAB_00c7722e;
      }
      if (uVar15 == 0x2000) {
        local_b8._0_4_ = (uVar9 >> 2 & 0x18 | (uint)(uVar24 >> 10) & 7) << 3;
        local_b8._8_4_ = (uint)(uVar24 >> 7) & 7 | 8;
        local_b8._4_4_ = uVar9 >> 2 & 7 | 8;
        goto LAB_00c77226;
      }
      if (uVar15 == 0x2001) {
        if ((uVar24 & 0xf80) != 0) {
          local_b8._0_4_ = (int)(uVar6 << 0x13) >> 0x1f & 0xffffffe0U | (uint)(uVar24 >> 2) & 0x1f;
          local_b8._4_4_ = uVar6 >> 7 & 0x1f;
          local_b8._8_4_ = local_b8._4_4_;
          gen_arith_imm_tl((DisasContext_conflict12 *)dcbase,(arg_i_conflict *)local_b8,gen_addw);
          goto LAB_00c774ff;
        }
        goto LAB_00c774f2;
      }
LAB_00c77236:
      if ((uVar24 & 3) == 0) {
        uVar3 = (uVar24 & 0xffff) >> 0xd;
        bVar23 = (byte)uVar24 >> 2 & 7 | 8;
        uVar9 = (uint)(uVar24 & 0xffff) >> 7;
        bVar21 = (byte)uVar9 & 7 | 8;
        local_80 = (DisasContext_conflict12 *)dcbase;
        local_78 = pTVar20;
        local_b8._0_8_ = aVar25;
        unique0x1000118a = pTVar19;
        if ((char)uVar3 == '\a') {
          local_88 = (ulong)((uVar9 & 0x38) + (uVar6 & 0x60) * 2);
          pTVar20 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
          pTVar19 = tcg_temp_new_internal_riscv64(pTVar20,TCG_TYPE_I64,false);
          pTVar14 = (TCGv_i64)((long)pTVar19 - (long)pTVar20);
          local_90 = (arg_jal)tcg_temp_new_internal_riscv64(pTVar20,TCG_TYPE_I64,false);
          pTVar13 = (TCGv_i64)((long)local_90 - (long)pTVar20);
          if (pTVar20->cpu_gpr[bVar21] != pTVar14) {
            tcg_gen_op2_riscv64(pTVar20,INDEX_op_mov_i64,(TCGArg)pTVar19,
                                (TCGArg)(pTVar20->cpu_gpr[bVar21] + (long)pTVar20));
          }
          tcg_gen_addi_i64_riscv64(pTVar20,pTVar14,pTVar14,local_88);
          if (pTVar20->cpu_gpr[bVar23] != pTVar13) {
            tcg_gen_op2_riscv64(pTVar20,INDEX_op_mov_i64,(TCGArg)local_90,
                                (TCGArg)(pTVar20->cpu_gpr[bVar23] + (long)pTVar20));
          }
          dcbase = &local_80->base;
          tcg_gen_qemu_st_i64_riscv64(pTVar20,pTVar13,pTVar14,(ulong)local_80->mem_idx,MO_64);
        }
        else {
          if ((int)uVar3 != 3) goto LAB_00c769c7;
          local_88 = (ulong)((uVar9 & 0x38) + (uVar6 & 0x60) * 2);
          pTVar20 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
          pTVar19 = tcg_temp_new_internal_riscv64(pTVar20,TCG_TYPE_I64,false);
          pTVar14 = (TCGv_i64)((long)pTVar19 - (long)pTVar20);
          local_90 = (arg_jal)tcg_temp_new_internal_riscv64(pTVar20,TCG_TYPE_I64,false);
          pTVar13 = (TCGv_i64)((long)local_90 - (long)pTVar20);
          if (pTVar20->cpu_gpr[bVar21] != pTVar14) {
            tcg_gen_op2_riscv64(pTVar20,INDEX_op_mov_i64,(TCGArg)pTVar19,
                                (TCGArg)(pTVar20->cpu_gpr[bVar21] + (long)pTVar20));
          }
          tcg_gen_addi_i64_riscv64(pTVar20,pTVar14,pTVar14,local_88);
          dcbase = &local_80->base;
          tcg_gen_qemu_ld_i64_riscv64(pTVar20,pTVar13,pTVar14,(ulong)local_80->mem_idx,MO_64);
          if (pTVar20->cpu_gpr[bVar23] != pTVar13) {
            tcg_gen_op2_riscv64(pTVar20,INDEX_op_mov_i64,
                                (TCGArg)(pTVar20->cpu_gpr[bVar23] + (long)pTVar20),(TCGArg)local_90)
            ;
          }
        }
        tcg_temp_free_internal_riscv64(pTVar20,(TCGTemp *)(pTVar14 + (long)pTVar20));
        tcg_temp_free_internal_riscv64(pTVar20,(TCGTemp *)(pTVar13 + (long)pTVar20));
        pTVar20 = local_78;
      }
    }
    else {
      uVar16 = (uint)(uVar24 >> 8);
      if (0xbfff < uVar15) {
        if (uVar15 < 0xe000) {
          if (uVar15 == 0xc000) {
            local_b8._0_4_ =
                 (uint)(uVar24 >> 1) & 0x10 | (uint)(uVar24 >> 9) & 0xe | (uint)(uVar24 >> 6) & 1;
            local_b8._4_4_ = (uint)(uVar24 >> 7) & 7 | 8;
            local_b8._8_4_ = uVar6 >> 2 & 7 | 8;
          }
          else {
            if (uVar15 == 0xc001) {
              local_b8._0_4_ =
                   (uVar6 & 0x60 | uVar16 & 0xc | (uint)(uVar24 >> 3) & 3) + (uVar6 & 4) * 4 |
                   (int)(uVar6 << 0x13) >> 0x1f & 0x7fffff80U;
              cond = TCG_COND_EQ;
LAB_00c76fb1:
              local_b8._4_4_ = uVar6 >> 7 & 7 | 8;
              local_b8._0_4_ = local_b8._0_4_ * 2;
              local_b8._8_4_ = 0;
              gen_branch((DisasContext_conflict12 *)dcbase,(arg_b *)local_b8,cond);
              goto LAB_00c774ff;
            }
            if (uVar15 != 0xc002) goto LAB_00c77236;
            local_b8._0_4_ = (uint)(uVar24 >> 3) & 0x30 | (uint)(uVar24 >> 9) & 0xf;
            local_b8._4_4_ = 2;
            local_b8._8_4_ = uVar6 >> 2 & 0x1f;
          }
          local_b8._0_4_ = local_b8._0_4_ << 2;
          MVar17 = MO_LESL;
        }
        else {
          if (uVar15 == 0xe000) {
            local_b8._0_4_ = uVar9 >> 2 & 0x18 | (uint)(uVar24 >> 10) & 7;
            local_b8._4_4_ = uVar6 >> 7 & 7 | 8;
            local_b8._8_4_ = uVar9 >> 2 & 7 | 8;
          }
          else {
            if (uVar15 == 0xe001) {
              local_b8._0_4_ =
                   (uVar6 & 0x60 | uVar16 & 0xc | (uint)(uVar24 >> 3) & 3) + (uVar6 & 4) * 4 |
                   (int)(uVar6 << 0x13) >> 0x1f & 0x7fffff80U;
              cond = TCG_COND_NE;
              goto LAB_00c76fb1;
            }
            if (uVar15 != 0xe002) goto LAB_00c77236;
            local_b8._0_4_ = (uint)(uVar24 >> 4) & 0x38 | (uint)(uVar24 >> 10) & 7;
            local_b8._4_4_ = 2;
            local_b8._8_4_ = uVar6 >> 2 & 0x1f;
          }
          local_b8._0_4_ = local_b8._0_4_ << 3;
          MVar17 = MO_64;
        }
        gen_store((DisasContext_conflict12 *)dcbase,(arg_sb *)local_b8,MVar17);
        goto LAB_00c774ff;
      }
      if (0x9fff < uVar15) {
        if (uVar15 == 0xa000) {
          local_b8._0_4_ = uVar9 >> 2 & 0x18 | (uint)(uVar24 >> 10) & 7;
          local_b8._4_4_ = (uint)(uVar24 >> 7) & 7 | 8;
          local_b8._8_4_ = uVar9 >> 2 & 7 | 8;
        }
        else {
          if (uVar15 == 0xa001) {
            local_b8._0_4_ =
                 (((uint)(uVar24 >> 2) & 0x1a0 | uVar6 & 0x40 | uVar16 & 8 | (uint)(uVar24 >> 3) & 7
                  ) + (uVar6 & 4) * 4 + (uVar6 & 0x100) * 2 |
                 (int)(uVar6 << 0x13) >> 0x1f & 0x7ffffc00U) * 2;
            local_b8._4_4_ = 0;
            trans_jal((DisasContext_conflict12 *)dcbase,(arg_jal *)local_b8);
            goto LAB_00c774ff;
          }
          if (uVar15 != 0xa002) goto LAB_00c77236;
          local_b8._0_4_ = (uint)(uVar24 >> 4) & 0x38 | (uint)(uVar24 >> 10) & 7;
          local_b8._4_4_ = 2;
          local_b8._8_4_ = (uint)(uVar24 >> 2) & 0x1f;
        }
        local_b8._0_4_ = local_b8._0_4_ << 3;
        _Var7 = trans_fsd((DisasContext_conflict12 *)dcbase,(arg_fsd *)local_b8);
        goto LAB_00c7722e;
      }
      if (uVar15 == 0x6002) {
        if ((uVar24 & 0xf80) == 0) goto LAB_00c774f2;
        local_b8._0_4_ =
             (((uint)(uVar24 >> 10) & 4 | (uint)(uVar24 >> 5) & 3) + (uVar6 & 0x1c) * 2) * 8;
        local_b8._8_4_ = 2;
        local_b8._4_4_ = uVar6 >> 7 & 0x1f;
LAB_00c771e0:
        MVar17 = MO_64;
        goto LAB_00c773a1;
      }
      if (uVar15 == 0x8001) {
        switch((uint)(uVar24 >> 10) & 3) {
        case 0:
          local_b8._0_4_ = uVar9 >> 7 & 7 | 8;
          uVar9 = uVar9 >> 7 & 0x20 | (uint)(uVar24 >> 2) & 0x1f;
          local_b8._8_4_ = 0x40;
          if (uVar9 != 0) {
            local_b8._8_4_ = uVar9;
          }
          local_b8._4_4_ = local_b8._0_4_;
          _Var7 = trans_srli((DisasContext_conflict12 *)dcbase,(arg_srli *)local_b8);
          break;
        case 1:
          local_b8._0_4_ = uVar9 >> 7 & 7 | 8;
          uVar9 = uVar9 >> 7 & 0x20 | (uint)(uVar24 >> 2) & 0x1f;
          local_b8._8_4_ = 0x40;
          if (uVar9 != 0) {
            local_b8._8_4_ = uVar9;
          }
          local_b8._4_4_ = local_b8._0_4_;
          _Var7 = trans_srai((DisasContext_conflict12 *)dcbase,(arg_srai *)local_b8);
          break;
        case 2:
          local_b8._0_4_ = (int)(uVar6 << 0x13) >> 0x1f & 0xffffffe0U | (uint)(uVar24 >> 2) & 0x1f;
          local_b8._4_4_ = uVar6 >> 7 & 7 | 8;
          pcVar18 = tcg_gen_andi_i64_riscv64;
          local_b8._8_4_ = local_b8._4_4_;
          goto LAB_00c7701d;
        case 3:
          uVar9 = (uint)(uVar24 >> 2);
          local_b8._8_4_ = uVar9 & 7 | 8;
          pTVar19 = (TCGTemp *)(CONCAT44(uStack_ac,uVar9) & 0xffffffff00000007 | 8);
          uVar15 = (uint)(uVar24 >> 7);
          local_b8._4_4_ = uVar15 & 7 | 8;
          aVar25 = (arg_jal)(CONCAT44(uVar15,uVar15) & 0x700000007 | 0x800000008);
          uVar16 = uVar6 & 0x1060;
          if (uVar16 < 0x60) {
            if ((uVar24 & 0x1060) == 0) {
              pTVar22 = puVar5->tcg_ctx;
              pcVar18 = tcg_gen_sub_i64;
            }
            else if (uVar16 == 0x20) {
              pTVar22 = puVar5->tcg_ctx;
              pcVar18 = tcg_gen_xor_i64_riscv64;
            }
            else {
              aVar25 = (arg_jal)(CONCAT44(uVar15,uVar15) & 0x700000007 | 0x800000008);
              pTVar19 = (TCGTemp *)(CONCAT44(uStack_ac,uVar9) & 0xffffffff00000007 | 8);
              if (uVar16 != 0x40) goto LAB_00c77236;
              pTVar22 = puVar5->tcg_ctx;
              pcVar18 = tcg_gen_or_i64_riscv64;
            }
          }
          else if (uVar16 == 0x60) {
            pTVar22 = puVar5->tcg_ctx;
            pcVar18 = tcg_gen_and_i64_riscv64;
          }
          else if (uVar16 == 0x1000) {
            pTVar22 = puVar5->tcg_ctx;
            pcVar18 = gen_subw;
          }
          else {
            if (uVar16 != 0x1020) goto LAB_00c77236;
            pTVar22 = puVar5->tcg_ctx;
            pcVar18 = gen_addw;
          }
LAB_00c7772a:
          local_b8._0_4_ = local_b8._4_4_;
          gen_arith(pTVar22,(arg_r_conflict *)local_b8,pcVar18);
          goto LAB_00c774ff;
        }
LAB_00c7722e:
        aVar25.rd = local_b8._4_4_;
        aVar25.imm = local_b8._0_4_;
        pTVar19 = (TCGTemp *)CONCAT44(uStack_ac,local_b8._8_4_);
        if (_Var7 == false) goto LAB_00c77236;
      }
      else {
        if (uVar15 != 0x8002) goto LAB_00c77236;
        if ((uVar6 >> 0xc & 1) == 0) {
          if ((uVar24 & 0xffc) == 0) goto LAB_00c774f2;
          local_b8._0_4_ = 0;
          if ((uVar24 & 0x7c) != 0) {
            local_b8._8_4_ = (uint)(uVar24 >> 2) & 0x1f;
            goto LAB_00c76b33;
          }
          local_b8._4_4_ = 0;
        }
        else {
          if ((uVar24 & 0xffc) == 0) {
            generate_exception((DisasContext_conflict12 *)dcbase,3);
            exit_tb((DisasContext_conflict12 *)dcbase);
            (((DisasContext_conflict12 *)dcbase)->base).is_jmp = DISAS_NORETURN;
            goto LAB_00c774ff;
          }
          if ((uVar24 & 0x7c) != 0) {
            local_b8._8_4_ = (uint)(uVar24 >> 2) & 0x1f;
            local_b8._4_4_ = uVar6 >> 7 & 0x1f;
            pTVar22 = puVar5->tcg_ctx;
            pcVar18 = tcg_gen_add_i64;
            goto LAB_00c7772a;
          }
          local_b8._4_4_ = 1;
        }
        local_b8._8_4_ = uVar6 >> 7 & 0x1f;
        local_b8._0_4_ = 0;
        trans_jalr((DisasContext_conflict12 *)dcbase,(arg_jalr *)local_b8);
      }
LAB_00c774ff:
      if (((DisasContext_conflict12 *)dcbase)->invalid == true) {
        ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
             ((DisasContext_conflict12 *)dcbase)->pc_succ_insn - 2;
      }
    }
    goto LAB_00c769c7;
  }
  unique0x10001042 = pTVar19;
  generate_exception((DisasContext_conflict12 *)dcbase,2);
LAB_00c769c7:
  if (bVar28) {
    paVar27 = &pTVar20->ops;
    if (local_70 != (void *)0x0) {
      paVar27 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_70 + 8);
    }
    paVar27->tqh_first->args[1] =
         ((DisasContext_conflict12 *)dcbase)->pc_succ_insn -
         (((DisasContext_conflict12 *)dcbase)->base).pc_next;
  }
  tVar1 = ((DisasContext_conflict12 *)dcbase)->pc_succ_insn;
  (((DisasContext_conflict12 *)dcbase)->base).pc_next = tVar1;
  if (((((DisasContext_conflict12 *)dcbase)->base).is_jmp == DISAS_NEXT) &&
     (0xfff < tVar1 - ((((DisasContext_conflict12 *)dcbase)->base).pc_first & 0xfffffffffffff000)))
  {
    (((DisasContext_conflict12 *)dcbase)->base).is_jmp = DISAS_TOO_MANY;
  }
  return;
}

Assistant:

static void riscv_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPURISCVState *env = cpu->env_ptr;
    uint16_t opcode16 = translator_lduw(tcg_ctx, env, ctx->base.pc_next);
    TCGOp *tcg_op, *prev_op = NULL;
    bool insn_hook = false;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // Unicorn: We have to exit current execution here.
        dcbase->is_jmp = DISAS_UC_EXIT;
    } else {
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

            // Sync PC in advance
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);

            // save the last operand
            prev_op = tcg_last_op(tcg_ctx);
            insn_hook = true;
            gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        decode_opc(env, ctx, opcode16);

        if (insn_hook) {
            // Unicorn: patch the callback to have the proper instruction size.
            if (prev_op) {
                // As explained further up in the function where prev_op is
                // assigned, we move forward in the tail queue, so we're modifying the
                // move instruction generated by gen_uc_tracecode() that contains
                // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
                tcg_op = QTAILQ_NEXT(prev_op, link);
            } else {
                // this instruction is the first emulated code ever,
                // so the instruction operand is the first operand
                tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
            }

            tcg_op->args[1] = ctx->pc_succ_insn - ctx->base.pc_next;
        }

        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}